

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

abctime Saig_ManBmcTimeToStop(Saig_ParBmc_t *pPars,abctime nTimeToStopNG)

{
  int iVar1;
  abctime aVar2;
  long lVar3;
  
  iVar1 = pPars->nTimeOutGap;
  if ((long)iVar1 == 0) {
    lVar3 = 0;
  }
  else {
    aVar2 = Abc_Clock();
    lVar3 = aVar2 + (long)iVar1 * 1000000;
    if ((nTimeToStopNG != 0) && (lVar3 != 0)) {
      if (nTimeToStopNG <= lVar3) {
        return nTimeToStopNG;
      }
      return lVar3;
    }
  }
  if (nTimeToStopNG != 0) {
    lVar3 = nTimeToStopNG;
  }
  return lVar3;
}

Assistant:

abctime Saig_ManBmcTimeToStop( Saig_ParBmc_t * pPars, abctime nTimeToStopNG )
{
    abctime nTimeToStopGap = pPars->nTimeOutGap ? pPars->nTimeOutGap * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime nTimeToStop = 0;
    if ( nTimeToStopNG && nTimeToStopGap )
        nTimeToStop = nTimeToStopNG < nTimeToStopGap ? nTimeToStopNG : nTimeToStopGap;
    else if ( nTimeToStopNG )
        nTimeToStop = nTimeToStopNG;
    else if ( nTimeToStopGap )
        nTimeToStop = nTimeToStopGap;
    return nTimeToStop;
}